

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.cpp
# Opt level: O0

unsigned_short
gr::MultiByteToWideChar
          (unsigned_long code_page,unsigned_long param_2,char *source,size_t src_count,
          unsigned_short *dest,size_t dst_count)

{
  size_t sVar1;
  ostream *poVar2;
  char *pcVar3;
  int *piVar4;
  size_t in_RCX;
  char *in_RDX;
  ulong in_RDI;
  char *in_R8;
  size_t in_R9;
  size_t dst_size;
  char *src_ptr;
  char *dst_ptr;
  iconv_t cdesc;
  char *tocode;
  __string_type fromcode;
  ostringstream oss;
  char *local_220;
  char *local_218;
  string local_210 [32];
  iconv_t local_1f0;
  char *local_1e8;
  string local_1e0 [48];
  ostringstream local_1b0 [376];
  size_t local_38;
  char *local_30;
  size_t local_28;
  char *local_20;
  ulong local_10;
  unsigned_short local_2;
  
  if (in_R8 == (char *)0x0) {
    local_2 = 0;
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_10 = in_RDI;
    if (in_RCX == 0xffffffffffffffff) {
      local_28 = strlen(in_RDX);
    }
    if (local_38 == 0) {
      local_2 = (short)local_28 * 3;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1b0);
      poVar2 = std::operator<<((ostream *)local_1b0,"CP");
      std::ostream::operator<<(poVar2,local_10);
      std::__cxx11::ostringstream::str();
      local_1e8 = "UCS-2LE";
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_1f0 = iconv_open("UCS-2LE",pcVar3);
      if (local_1f0 == (iconv_t)0xffffffffffffffff) {
        poVar2 = std::operator<<((ostream *)&std::cerr,program_invocation_short_name);
        poVar2 = std::operator<<(poVar2,": iconv_open(\"");
        poVar2 = std::operator<<(poVar2,"UCS-2LE");
        poVar2 = std::operator<<(poVar2,"\", \"");
        std::__cxx11::ostringstream::str();
        poVar2 = std::operator<<(poVar2,local_210);
        poVar2 = std::operator<<(poVar2,"\"): ");
        piVar4 = __errno_location();
        pcVar3 = strerror(*piVar4);
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_210);
        exit(1);
      }
      local_218 = local_30;
      local_220 = local_20;
      sVar1 = local_38 * 2;
      local_38 = sVar1;
      iconv(local_1f0,&local_220,&local_28,&local_218,&local_38);
      iconv_close(local_1f0);
      local_2 = (short)sVar1 - (short)local_38;
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::ostringstream::~ostringstream(local_1b0);
    }
  }
  return local_2;
}

Assistant:

unsigned short MultiByteToWideChar(unsigned long code_page, unsigned long, 
        const char * source, size_t src_count, 
        unsigned short * dest, size_t dst_count)
{
    if (!dest)	// An error condition is indicated by 0
        return 0;

    if (src_count == size_t(-1))     // When passed -1 it should find the 
	src_count = strlen(source);  // length of the source it's self

    if (dst_count == 0)		// We cannot find the completed size so esitmate it.
	return src_count*3;

    std::ostringstream oss; oss << "CP" << code_page;
    auto const fromcode = oss.str();

#if WORDS_BIGENDIAN
    auto const tocode = "UCS-2BE";
#else
    auto const tocode = "UCS-2LE";
#endif
    iconv_t cdesc = iconv_open(tocode, fromcode.c_str());
   
    if (cdesc == iconv_t(-1))
    {
	std::cerr << program_invocation_short_name
                  << ": iconv_open(\"" << tocode << "\", \"" << oss.str() << "\"): "
                  << strerror(errno) << std::endl;
	exit(1);
    }

    char *dst_ptr = reinterpret_cast<char *>(dest);
    char *src_ptr = const_cast<char *>(source);
    dst_count *= sizeof(unsigned short);    
    const size_t dst_size = dst_count;

    iconv(cdesc, &src_ptr, &src_count, &dst_ptr, &dst_count);
    iconv_close(cdesc);
    
    return dst_size - dst_count;
}